

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewCNF.hpp
# Opt level: O3

bool __thiscall Shell::NewCNF::Occurrences::Iterator::hasNext(Iterator *this)

{
  bool bVar1;
  uint uVar2;
  List<Shell::NewCNF::Occurrence> *pLVar3;
  List<Shell::NewCNF::Occurrence> *pLVar4;
  GenClause *x;
  RefCounter *pRVar5;
  void **head;
  List<Shell::NewCNF::Occurrence> **ppLVar6;
  List<Shell::NewCNF::Occurrence> **ppLVar7;
  void **head_1;
  Occurrence occ;
  SmartPtr<Shell::NewCNF::Occurrence> local_78;
  SmartPtr<Shell::NewCNF::Occurrence> *local_68;
  FixedSizeAllocator<24UL> *local_60;
  GenClause *local_58;
  RefCounter *local_50;
  GenClause *local_48;
  RefCounter *local_40;
  uint local_38;
  
  local_68 = &this->_current;
  local_60 = (FixedSizeAllocator<24UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30);
  do {
    ppLVar6 = (this->_iterator)._lst;
    pLVar3 = (this->_iterator)._cur;
    ppLVar7 = &pLVar3->_tail;
    if (pLVar3 == (List<Shell::NewCNF::Occurrence> *)0x0) {
      ppLVar7 = ppLVar6;
    }
    pLVar4 = *ppLVar7;
    if (pLVar4 == (List<Shell::NewCNF::Occurrence> *)0x0) break;
    if (pLVar3 != (List<Shell::NewCNF::Occurrence> *)0x0) {
      (this->_iterator)._prev = pLVar3;
      ppLVar6 = &pLVar3->_tail;
    }
    pLVar3 = *ppLVar6;
    (this->_iterator)._cur = pLVar3;
    x = (pLVar3->_head).gc._obj;
    pRVar5 = (pLVar3->_head).gc._refCnt;
    if (pRVar5 != (RefCounter *)0x0 && x != (GenClause *)0x0) {
      pRVar5->_val = pRVar5->_val + 1;
    }
    uVar2 = (pLVar3->_head).position;
    bVar1 = x->valid;
    local_48 = x;
    local_40 = pRVar5;
    local_38 = uVar2;
    if (bVar1 == false) {
      Lib::List<Shell::NewCNF::Occurrence>::DelIterator::del(&this->_iterator);
    }
    else {
      local_78._obj = (Occurrence *)Lib::FixedSizeAllocator<24UL>::alloc(local_60);
      if (pRVar5 != (RefCounter *)0x0) {
        pRVar5->_val = pRVar5->_val + 2;
      }
      ((local_78._obj)->gc)._obj = x;
      ((local_78._obj)->gc)._refCnt = pRVar5;
      (local_78._obj)->position = uVar2;
      local_58 = x;
      local_50 = pRVar5;
      local_78._refCnt =
           (RefCounter *)
           Lib::FixedSizeAllocator<8UL>::alloc
                     ((FixedSizeAllocator<8UL> *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR);
      (local_78._refCnt)->_val = 1;
      Lib::SmartPtr<Shell::NewCNF::Occurrence>::operator=(local_68,&local_78);
      if (((local_78._obj != (Occurrence *)0x0) && (local_78._refCnt != (RefCounter *)0x0)) &&
         ((local_78._refCnt)->_val = (local_78._refCnt)->_val + -1, (local_78._refCnt)->_val == 0))
      {
        checked_delete<Shell::NewCNF::Occurrence>(local_78._obj);
        if (local_78._refCnt != (RefCounter *)0x0) {
          *(undefined8 *)local_78._refCnt = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
          Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_78._refCnt;
        }
      }
      if ((pRVar5 != (RefCounter *)0x0) && (pRVar5->_val = pRVar5->_val + -1, pRVar5->_val == 0)) {
        checked_delete<Shell::NewCNF::GenClause>(x);
        *(undefined8 *)pRVar5 = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
        Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = pRVar5;
      }
    }
    if ((pRVar5 != (RefCounter *)0x0) && (pRVar5->_val = pRVar5->_val + -1, pRVar5->_val == 0)) {
      checked_delete<Shell::NewCNF::GenClause>(x);
      *(undefined8 *)pRVar5 = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = pRVar5;
    }
  } while (bVar1 == false);
  return pLVar4 != (List<Shell::NewCNF::Occurrence> *)0x0;
}

Assistant:

inline bool hasNext() {
        while (_iterator.hasNext()) {
          Occurrence occ = _iterator.next();
          if (!occ.gc->valid) {
            _iterator.del();
            continue;
          }
          _current = SmartPtr<Occurrence>(new Occurrence(occ.gc, occ.position));
          return true;
        }
        return false;
      }